

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON__UINT32 __thiscall
ON_XMLNode::ReadFromStream
          (ON_XMLNode *this,wchar_t *stream,bool bWarningsAsErrors,bool bValidateTags)

{
  wchar_t wVar1;
  ON_XMLNodePrivate *this_00;
  ON_XMLPropertyPrivate *this_01;
  CPropertyData *pCVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  wchar_t *pwVar7;
  undefined4 extraout_var;
  ON_XMLNode *this_02;
  ON_XMLProperty *this_03;
  ON_XMLVariant *this_04;
  undefined7 in_register_00000011;
  wchar_t *pwVar8;
  ON__UINT32 OVar9;
  ulong uVar10;
  ON_wString sDefaultProperty;
  ON_wString tag;
  ON_wString OStack_168;
  ON_wString local_160;
  ON_XMLNode *local_158;
  uint local_14c;
  wchar_t *local_148;
  ON_wString local_140;
  uint local_134;
  wchar_t *local_130;
  ON_XMLVariant local_128;
  undefined4 extraout_var_00;
  
  local_158 = this;
  if (stream == (wchar_t *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xd8e,"","Stream cannot be null");
    return 0xffffffff;
  }
  if (bWarningsAsErrors) {
    g_iWarningsFlagCounter = g_iWarningsFlagCounter + 1;
  }
  local_14c = (uint)CONCAT71(in_register_00000011,bWarningsAsErrors);
  (*this->_vptr_ON_XMLNode[0x14])();
  local_148 = stream;
  local_130 = stream;
  ON_wString::ON_wString(&local_160);
  bVar3 = ON_XMLNodePrivate::GetNextTag(&local_160,&local_148,bValidateTags);
  OVar9 = 0xffffffff;
  if ((bVar3) && (bVar3 = ON_wString::IsEmpty(&local_160), !bVar3)) {
    this_00 = local_158->_private;
    this_00->m_last_read_buf_ptr = local_130;
    ON_XMLNodePrivate::GetPropertiesFromTag(this_00,&local_160);
    iVar5 = ON_wString::Length(&local_160);
    pwVar7 = ON_wString::operator[](&local_160,iVar5 + -2);
    if (*pwVar7 != L'/') {
      ON_wString::ON_wString(&OStack_168);
      bVar3 = false;
      local_134 = local_14c & 0xff;
      do {
        pwVar7 = local_148;
        iVar5 = 0;
        for (pwVar8 = local_148; wVar1 = *pwVar8, wVar1 != L'\0'; pwVar8 = pwVar8 + 1) {
          if (wVar1 == L'<') {
            ON_REMOVE_ASAP_AssertEx
                      ((uint)(wVar1 == L'<'),
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                       ,0xdc2,"","*start == L\'<\' is false");
            if (*pwVar8 == L'<') {
              ON_wString::Append(&OStack_168,pwVar7,iVar5);
            }
            local_148 = pwVar8;
            bVar4 = ON_XMLNodePrivate::GetNextTag(&local_160,&local_148,bValidateTags);
            if (bVar4) {
              bVar3 = ON_XMLNodePrivate::IsClosingTag(local_158->_private,&local_160);
              bVar4 = true;
              if (bVar3) goto LAB_00694295;
              this_02 = (ON_XMLNode *)operator_new(0xe8);
              ON_XMLNode(this_02,L"");
              (*local_158->_vptr_ON_XMLNode[0xb])(local_158,this_02);
              uVar6 = (*this_02->_vptr_ON_XMLNode[0x17])
                                (this_02,pwVar7,(ulong)local_134,bValidateTags);
              if (uVar6 != 0xffffffff) {
                local_148 = pwVar7 + uVar6;
                goto LAB_00694295;
              }
            }
            break;
          }
          iVar5 = iVar5 + 1;
        }
        bVar4 = false;
LAB_00694295:
        if (!bVar4) {
          ON_wString::~ON_wString(&OStack_168);
          goto LAB_006943c7;
        }
      } while (bVar3 == false);
      ON_wString::TrimLeft(&OStack_168,(wchar_t *)0x0);
      ON_wString::TrimRight(&OStack_168,(wchar_t *)0x0);
      DecodeXML(&OStack_168);
      bVar3 = ON_wString::IsEmpty(&OStack_168);
      if (!bVar3) {
        this_03 = (ON_XMLProperty *)operator_new(0x68);
        ON_XMLProperty::ON_XMLProperty(this_03);
        (*local_158->_vptr_ON_XMLNode[0xc])(local_158,this_03);
        iVar5 = -1;
        if (ON_XMLNodePrivate::m_bAutoTypePropValue == true) {
          iVar5 = ON_wString::Find(&OStack_168,L":");
        }
        if (iVar5 < 1) {
          ON_XMLPropertyPrivate::SetHugeStringValue(this_03->_private,&OStack_168);
          this_01 = this_03->_private;
          ON_XMLPropertyPrivate::CopyOnWrite(this_01);
          pCVar2 = this_01->_data;
          (*(pCVar2->m_value)._vptr_ON_XMLVariant[0x2f])(&pCVar2->m_value,1);
        }
        else {
          iVar5 = (*this_03->_vptr_ON_XMLProperty[9])(this_03);
          this_04 = (ON_XMLVariant *)CONCAT44(extraout_var_00,iVar5);
          ON_wString::Mid(&local_140,(int)&OStack_168);
          ::ON_XMLVariant::ON_XMLVariant(&local_128,&local_140);
          ::ON_XMLVariant::operator=(this_04,&local_128);
          ::ON_XMLVariant::~ON_XMLVariant(&local_128);
          ON_wString::~ON_wString(&local_140);
          (*this_04->_vptr_ON_XMLVariant[0x2f])(this_04,1);
        }
      }
      ON_wString::~ON_wString(&OStack_168);
      if (!bVar4) goto LAB_006943c7;
    }
    iVar5 = (*local_158->_vptr_ON_XMLNode[9])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 200))
              ((long *)CONCAT44(extraout_var,iVar5),local_158);
    uVar10 = (long)local_148 - (long)local_130;
    for (; (*local_148 == L'\r' || (*local_148 == L'\n')); local_148 = local_148 + 1) {
      uVar10 = uVar10 + 4;
    }
    OVar9 = (ON__UINT32)(uVar10 >> 2);
  }
LAB_006943c7:
  ON_wString::~ON_wString(&local_160);
  if ((char)local_14c != '\0') {
    g_iWarningsFlagCounter = g_iWarningsFlagCounter + -1;
  }
  return OVar9;
}

Assistant:

ON__UINT32 ON_XMLNode::ReadFromStream(const wchar_t* stream, bool bWarningsAsErrors, bool bValidateTags)
{
  if (nullptr == stream)
  {
    ON_ERROR("Stream cannot be null");
    return ReadError;
  }

  CWarningHelper wh(bWarningsAsErrors);

  Clear();

  // Search for the opening tag "<" character.
  wchar_t* pBuffer = const_cast<wchar_t*>(stream);

  ON_wString tag;

  // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
  // The original code was not checking GetNextTag() for failure and blindly continuing with an empty tag.
  // Then in some places it assumed that the tag was not empty. This is confusing because I thought
  // this was causing RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
  if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
    return ReadError;

  if (tag.IsEmpty())
    return ReadError;

  _private->m_last_read_buf_ptr = (void*)stream;

  _private->GetPropertiesFromTag(tag);

  const auto pos1 = tag.Length() - 2; // Assumes the tag is not empty.
  if (tag[pos1] != L'/')
  {
    // This tag either has children, or a default property.
    ON_wString sDefaultProperty;

    bool bClosingTag = false;
    do
    {
      auto* pStoreBuffer = pBuffer;

      // Get anything between the tags and store as the default parameter.
      auto* start = pBuffer;
      while ((*start != L'<') && (*start != 0))
      {
        start++;
      }

      if (0 == *start)
      {
        // We ran off the end of the buffer - no idea why, but this is bad, so fail.
        // See http://mcneel.myjetbrains.com/youtrack/issue/RH-16605 for example.
        return ReadError;
      }

      ON_ASSERT(*start == L'<');

      if (nullptr != start && *start == L'<')
      {
        sDefaultProperty.Append(pBuffer, (int)(start - pBuffer));
      }

      pBuffer = start;

      // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
      // The original code was not checking GetNextTag() for failure and blindly continuing with
      // an empty tag. This caused continuous child recursion because the buffer pointer was
      // still pointing at the same (bad) XML. This is confusing because I thought this was causing
      // RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
      if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
        return ReadError;

      bClosingTag = _private->IsClosingTag(tag);

      if (!bClosingTag)
      {
        auto* pNode = new ON_XMLNode(L"");
        AttachChildNode(pNode);

        const auto read = pNode->ReadFromStream(pStoreBuffer, bWarningsAsErrors, bValidateTags);
        if (ReadError == read)
          return ReadError;

        pBuffer = pStoreBuffer + read;
      }
    }
    while (!bClosingTag);

    sDefaultProperty.TrimLeft();
    sDefaultProperty.TrimRight();
    DecodeXML(sDefaultProperty);

    if (!sDefaultProperty.IsEmpty())
    {
      auto* pProp = new ON_XMLProperty;
      AttachProperty(pProp);

      const int pos2 = ON_XMLNodePrivate::m_bAutoTypePropValue ? sDefaultProperty.Find(L":") : -1;
      if (pos2 > 0)
      {
        auto& v = pProp->GetNonConstValue();
        v = sDefaultProperty.Mid(pos2 + 1);
        v.SetTypePendingFlag(true);
      }
      else
      {
        pProp->_private->SetHugeStringValue(sDefaultProperty);
        pProp->_private->GetNonConstValue().SetTypePendingFlag(true);
      }
    }
  }

  TopLevel().OnNodeReadFromStream(this);

  while ((*pBuffer == L'\r') || (*pBuffer == L'\n'))
    pBuffer++;

  return ON__UINT32(pBuffer - stream);
}